

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

void __thiscall duckdb::LoadInfo::Serialize(LoadInfo *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"info_type");
  Serializer::WriteValue<duckdb::ParseInfoType>(serializer,(this->super_ParseInfo).info_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,200,"filename",&this->filename);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"load_type");
  Serializer::WriteValue<duckdb::LoadType>(serializer,this->load_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xca,"repository",&this->repository);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xcb,"version",&this->version);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcc,"repo_is_alias",&this->repo_is_alias);
  return;
}

Assistant:

void LoadInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "filename", filename);
	serializer.WriteProperty<LoadType>(201, "load_type", load_type);
	serializer.WritePropertyWithDefault<string>(202, "repository", repository);
	serializer.WritePropertyWithDefault<string>(203, "version", version);
	serializer.WritePropertyWithDefault<bool>(204, "repo_is_alias", repo_is_alias);
}